

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v9::detail::bigint::remove_leading_zeros(bigint *this)

{
  int value;
  type tVar1;
  size_t sVar2;
  bigit *pbVar3;
  bool bVar4;
  int local_14;
  int num_bigits;
  bigint *this_local;
  
  sVar2 = buffer<unsigned_int>::size((buffer<unsigned_int> *)this);
  local_14 = (int)sVar2;
  do {
    value = local_14;
    local_14 = value + -1;
    bVar4 = false;
    if (0 < local_14) {
      pbVar3 = operator[](this,local_14);
      bVar4 = *pbVar3 == 0;
    }
  } while (bVar4);
  tVar1 = to_unsigned<int>(value);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
            (&this->bigits_,(ulong)tVar1);
  return;
}

Assistant:

FMT_CONSTEXPR20 void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && (*this)[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }